

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall ON_Viewport::GetBBox(ON_Viewport *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  bool bVar1;
  ON_3dPoint corners [9];
  
  bVar1 = GetNearRect(this,corners,corners + 1,corners + 2,corners + 3);
  if (bVar1) {
    bVar1 = GetFarRect(this,corners + 4,corners + 5,corners + 6,corners + 7);
  }
  corners[8].z = (this->m_CamLoc).z;
  corners[8].x = (this->m_CamLoc).x;
  corners[8].y = (this->m_CamLoc).y;
  if (bVar1 != false) {
    bVar1 = ON_GetPointListBoundingBox(3,false,9,3,&corners[0].x,boxmin,boxmax,(uint)bGrowBox);
  }
  return bVar1;
}

Assistant:

bool ON_Viewport::GetBBox( 
       double* boxmin,
       double* boxmax,
       bool bGrowBox
       ) const
{
  ON_3dPoint corners[9];
  bool rc = GetNearRect(corners[0],corners[1],corners[2],corners[3]);
  if (rc)
    rc = GetFarRect(corners[4],corners[5],corners[6],corners[7]);
  corners[8] = m_CamLoc;
  if (rc)
  {
    rc = ON_GetPointListBoundingBox( 
            3, 0, 9, 
            3, &corners[0].x, 
            boxmin, boxmax,  bGrowBox?true:false
            );
  }
  return rc;
}